

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void xmlListPopBack(xmlListPtr l)

{
  xmlLinkPtr pxVar1;
  _xmlLink *p_Var2;
  
  if ((l != (xmlListPtr)0x0) && (l->sentinel->next != l->sentinel)) {
    pxVar1 = l->sentinel->prev;
    p_Var2 = pxVar1->prev;
    p_Var2->next = pxVar1->next;
    pxVar1->next->prev = p_Var2;
    if (l->linkDeallocator != (_func_void_xmlLinkPtr *)0x0) {
      (*l->linkDeallocator)(pxVar1);
    }
    (*xmlFree)(pxVar1);
    return;
  }
  return;
}

Assistant:

void
xmlListPopBack(xmlListPtr l)
{
    if(!xmlListEmpty(l))
        xmlLinkDeallocator(l, l->sentinel->prev);
}